

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * CPP::formLayoutRole(int column,int colspan)

{
  QLatin1StringView latin1;
  int in_EDX;
  int in_ESI;
  QString *in_RDI;
  QLatin1StringView QVar1;
  QString *in_stack_ffffffffffffffd0;
  QString *pQVar2;
  QString *this;
  
  if (in_EDX < 2) {
    pQVar2 = in_RDI;
    if (in_ESI == 0) {
      QVar1 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_RDI);
      this = (QString *)QVar1.m_size;
    }
    else {
      QVar1 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_RDI);
      this = (QString *)QVar1.m_size;
    }
    QVar1.m_size._4_4_ = in_ESI;
    QVar1.m_size._0_4_ = in_EDX;
    QVar1.m_data = (char *)pQVar2;
    QString::QString(this,QVar1);
  }
  else {
    pQVar2 = in_RDI;
    Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_RDI);
    latin1.m_size._4_4_ = in_ESI;
    latin1.m_size._0_4_ = in_EDX;
    latin1.m_data = (char *)pQVar2;
    QString::QString(in_stack_ffffffffffffffd0,latin1);
  }
  return in_RDI;
}

Assistant:

static inline QString formLayoutRole(int column, int colspan)
{
    if (colspan > 1)
        return "QFormLayout::ItemRole::SpanningRole"_L1;
    return column == 0
        ? "QFormLayout::ItemRole::LabelRole"_L1 : "QFormLayout::ItemRole::FieldRole"_L1;
}